

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::ConfidentialTransaction::GetWitnessOnlyHash
          (ByteData256 *__return_storage_ptr__,ConfidentialTransaction *this)

{
  bool bVar1;
  unsigned_long *puVar2;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *this_00;
  reference this_01;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *this_02;
  reference this_03;
  undefined1 local_f0 [8];
  ByteData256 hash_out;
  ConfidentialTxOut *vout;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *__range2_1;
  ByteData256 hash_in;
  ConfidentialTxIn *vin;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *__range2;
  size_type local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> leaves;
  ConfidentialTransaction *this_local;
  
  leaves.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  local_38 = ::std::
             vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::size
                       (&this->vin_);
  local_40 = ::std::
             vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
             size(&this->vout_);
  puVar2 = ::std::max<unsigned_long>(&local_38,&local_40);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::reserve
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
             *puVar2);
  this_00 = &this->vin_;
  __end2 = ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ::begin(this_00);
  vin = (ConfidentialTxIn *)
        ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
        end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
                                *)&vin);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
              ::operator*(&__end2);
    ConfidentialTxIn::GetWitnessHash
              ((ByteData256 *)
               &hash_in.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this_01);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               (value_type *)
               &hash_in.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ByteData256::~ByteData256((ByteData256 *)0x4bf01b);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxIn_*,_std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>_>
    ::operator++(&__end2);
  }
  CryptoUtil::ComputeFastMerkleRoot
            ((ByteData256 *)&__range2_1,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::clear
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  this_02 = &this->vout_;
  __end2_1 = ::std::
             vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
             begin(this_02);
  vout = (ConfidentialTxOut *)
         ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
         ::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
                        *)&vout);
    if (!bVar1) break;
    this_03 = __gnu_cxx::
              __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
              ::operator*(&__end2_1);
    ConfidentialTxOut::GetWitnessHash
              ((ByteData256 *)
               &hash_out.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,this_03);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
               (value_type *)
               &hash_out.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    ByteData256::~ByteData256((ByteData256 *)0x4bf106);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxOut_*,_std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>_>
    ::operator++(&__end2_1);
  }
  CryptoUtil::ComputeFastMerkleRoot
            ((ByteData256 *)local_f0,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::clear
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
             (value_type *)&__range2_1);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::push_back
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30,
             (value_type *)local_f0);
  CryptoUtil::ComputeFastMerkleRoot
            (__return_storage_ptr__,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_30);
  ByteData256::~ByteData256((ByteData256 *)0x4bf1a9);
  ByteData256::~ByteData256((ByteData256 *)0x4bf1b5);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTransaction::GetWitnessOnlyHash() const {
  std::vector<ByteData256> leaves;
  leaves.reserve(std::max(vin_.size(), vout_.size()));
  for (const auto &vin : vin_) {
    leaves.push_back(vin.GetWitnessHash());
  }
  ByteData256 hash_in = CryptoUtil::ComputeFastMerkleRoot(leaves);
  leaves.clear();

  for (const auto &vout : vout_) {
    leaves.push_back(vout.GetWitnessHash());
  }
  ByteData256 hash_out = CryptoUtil::ComputeFastMerkleRoot(leaves);
  leaves.clear();

  leaves.push_back(hash_in);
  leaves.push_back(hash_out);
  return CryptoUtil::ComputeFastMerkleRoot(leaves);
}